

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_put_test.cc
# Opt level: O2

void __thiscall IntegrationTest_TestIoPut_Test::TestBody(IntegrationTest_TestIoPut_Test *this)

{
  long *plVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  Qiniu_Error QVar7;
  AssertHelper local_300;
  long httpCode;
  AssertHelper local_2f0;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  char text [14];
  Qiniu_RS_GetPolicy getPolicy;
  Qiniu_Io_PutRet putRet;
  Qiniu_Client client_1;
  char key [100];
  Qiniu_Client client;
  Qiniu_RS_PutPolicy local_d8;
  
  uVar2 = rand();
  snprintf(key,100,"key_%d",(ulong)uVar2);
  Qiniu_Client_InitMacAuth(&client,0x400,(Qiniu_Mac *)0x0);
  Qiniu_Client_SetTimeout(&client,5000);
  Qiniu_Client_SetConnectTimeout(&client,3000);
  Qiniu_Client_EnableAutoQuery(&client,1);
  memset(&local_d8.saveKey,0,0xa0);
  local_d8.scope = Test_bucket;
  pcVar3 = Qiniu_RS_PutPolicy_Token(&local_d8,(Qiniu_Mac *)0x0);
  Qiniu_RS_Delete(&client,Test_bucket,key);
  putRet.hash = (char *)0x0;
  putRet.key = (char *)0x0;
  putRet.persistentId = (char *)0x0;
  Qiniu_Client_InitNoAuth(&client_1,0x400);
  Qiniu_Client_EnableAutoQuery(&client_1,1);
  QVar7 = Qiniu_Io_PutFile(&client_1,&putRet,pcVar3,key,
                           "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
                           ,(Qiniu_Io_PutExtra *)0x0);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )QVar7.message;
  gtest_ar_3._0_4_ = QVar7.code;
  text[0] = -0x38;
  text[1] = '\0';
  text[2] = '\0';
  text[3] = '\0';
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"err.code","200",(int *)&gtest_ar_3,(int *)text);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)text);
    if ((undefined8 *)
        CONCAT26(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._6_2_,
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_6_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT26(gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._6_2_,
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_6_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&httpCode,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x15,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&httpCode,(Message *)text);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&httpCode);
    plVar1 = (long *)CONCAT26(text._6_2_,CONCAT24(text._4_2_,text._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar4 = Qiniu_Buffer_CStr(&client_1.respHeader);
  Qiniu_Stderr_Debug("%s",pcVar4);
  pcVar4 = "";
  pcVar6 = putRet.hash;
  if (putRet.hash == (char *)0x0) {
    pcVar6 = "";
  }
  Qiniu_Stderr_Debug("hash: %s",pcVar6);
  Qiniu_Client_Cleanup(&client_1);
  Qiniu_RS_Delete(&client,Test_bucket,key);
  builtin_strncpy(text + 8,"orld!",6);
  builtin_strncpy(text,"Hello, w",8);
  putRet.hash = (char *)0x0;
  putRet.key = (char *)0x0;
  putRet.persistentId = (char *)0x0;
  Qiniu_Client_InitNoAuth(&client_1,0x400);
  Qiniu_Client_EnableAutoQuery(&client_1,1);
  QVar7 = Qiniu_Io_PutBuffer(&client_1,&putRet,pcVar3,key,text,0xd,(Qiniu_Io_PutExtra *)0x0);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )QVar7.message;
  gtest_ar_3._0_4_ = QVar7.code;
  pcVar6 = Qiniu_Buffer_CStr(&client_1.respHeader);
  Qiniu_Stderr_Debug("%s",pcVar6);
  pcVar6 = putRet.hash;
  if (putRet.hash == (char *)0x0) {
    pcVar6 = "";
  }
  Qiniu_Stderr_Debug("hash: %s",pcVar6);
  httpCode._0_4_ = 200;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"err.code","200",(int *)&gtest_ar_3,(int *)&httpCode);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&httpCode);
    if ((undefined8 *)
        CONCAT26(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._6_2_,
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_6_) != (undefined8 *)0x0) {
      pcVar4 = *(char **)CONCAT26(gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._6_2_,
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_6_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x2e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&httpCode);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((long *)CONCAT44(httpCode._4_4_,(undefined4)httpCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(httpCode._4_4_,(undefined4)httpCode) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"putRet.hash","\"FpQ6cC0G80WZruH42o759ylgMdaZ\"",putRet.hash,
             "FpQ6cC0G80WZruH42o759ylgMdaZ");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&httpCode);
    if ((undefined8 *)
        CONCAT26(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._6_2_,
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_6_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT26(gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._6_2_,
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_6_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x2f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&httpCode);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((long *)CONCAT44(httpCode._4_4_,(undefined4)httpCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(httpCode._4_4_,(undefined4)httpCode) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Qiniu_Client_Cleanup(&client_1);
  Qiniu_Free(pcVar3);
  getPolicy.expires = 0;
  pcVar3 = Qiniu_RS_MakeBaseUrl(Test_Domain,key);
  pcVar4 = Qiniu_RS_GetPolicy_MakeRequest(&getPolicy,pcVar3,(Qiniu_Mac *)0x0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_6_ = 0x21646c726f;
  gtest_ar.success_ = true;
  gtest_ar._1_5_ = 0x2c6f6c6c65;
  gtest_ar._6_2_ = 0x7720;
  uVar5 = curl_easy_init();
  Qiniu_Buffer_Init((Qiniu_Buffer *)&client_1,0x400);
  Qiniu_Buffer_Init((Qiniu_Buffer *)&putRet,0x400);
  Qiniu_Stderr_Debug("url: %s",pcVar4);
  curl_easy_setopt(uVar5,0x2712,pcVar4);
  curl_easy_setopt(uVar5,0x4e2b,Qiniu_Buffer_Fwrite);
  curl_easy_setopt(uVar5,0x2711,&client_1);
  curl_easy_setopt(uVar5,0x4e6f,Qiniu_Buffer_Fwrite);
  curl_easy_setopt(uVar5,0x272d,(Qiniu_Buffer *)&putRet);
  text._0_4_ = curl_easy_perform(uVar5);
  text[4] = '\0';
  text[5] = '\0';
  text[6] = '\0';
  text[7] = '\0';
  pcVar6 = Qiniu_Buffer_CStr((Qiniu_Buffer *)&putRet);
  Qiniu_Stderr_Debug("%s",pcVar6);
  local_300.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_3,"code","0",(long *)text,(int *)&local_300);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_300);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x4b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  curl_easy_getinfo(uVar5,0x200002,&httpCode);
  local_300.data_._0_4_ = 200;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_3,"httpCode","200",&httpCode,(int *)&local_300);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_300);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x4e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  pcVar6 = Qiniu_Buffer_CStr((Qiniu_Buffer *)&client_1);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"Qiniu_Buffer_CStr(&resp)","text",pcVar6,&gtest_ar.success_);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_300);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x50,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  curl_easy_cleanup(uVar5);
  Qiniu_Free(pcVar4);
  Qiniu_Free(pcVar3);
  Qiniu_Client_Cleanup(&client);
  return;
}

Assistant:

TEST(IntegrationTest, TestIoPut)
{
	Qiniu_Client client;
	Qiniu_RS_PutPolicy putPolicy;
	Qiniu_RS_GetPolicy getPolicy;
	char *uptoken;
	char *dnBaseUrl;
	char *dnRequest;
	char key[100];
	Qiniu_snprintf(key, 100, "key_%d", rand());

	Qiniu_Client_InitMacAuth(&client, 1024, NULL);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	Qiniu_Zero(putPolicy);
	putPolicy.scope = Test_bucket;
	uptoken = Qiniu_RS_PutPolicy_Token(&putPolicy, NULL);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutFile(uptoken, key);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutBuffer(uptoken, key);

	Qiniu_Free(uptoken);

	Qiniu_Zero(getPolicy);
	dnBaseUrl = Qiniu_RS_MakeBaseUrl(Test_Domain, key);
	dnRequest = Qiniu_RS_GetPolicy_MakeRequest(&getPolicy, dnBaseUrl, NULL);

	clientIoGet(dnRequest);

	Qiniu_Free(dnRequest);
	Qiniu_Free(dnBaseUrl);

	Qiniu_Client_Cleanup(&client);
}